

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O2

PKCS7 * d2i_PKCS7_bio(BIO *bp,PKCS7 **p7)

{
  int iVar1;
  PKCS7 *pPVar2;
  uint8_t *data;
  size_t len;
  CBS cbs;
  uint8_t *local_30;
  size_t local_28;
  CBS local_20;
  
  iVar1 = BIO_read_asn1((BIO *)bp,&local_30,&local_28,0x400000);
  if (iVar1 == 0) {
    pPVar2 = (PKCS7 *)0x0;
  }
  else {
    local_20.data = local_30;
    local_20.len = local_28;
    pPVar2 = (PKCS7 *)pkcs7_new(&local_20);
    OPENSSL_free(local_30);
    if (pPVar2 != (PKCS7 *)0x0 && p7 != (PKCS7 **)0x0) {
      PKCS7_free(*p7);
      *p7 = pPVar2;
    }
  }
  return pPVar2;
}

Assistant:

PKCS7 *d2i_PKCS7_bio(BIO *bio, PKCS7 **out) {
  // Use a generous bound, to allow for PKCS#7 files containing large root sets.
  static const size_t kMaxSize = 4 * 1024 * 1024;
  uint8_t *data;
  size_t len;
  if (!BIO_read_asn1(bio, &data, &len, kMaxSize)) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, data, len);
  PKCS7 *ret = pkcs7_new(&cbs);
  OPENSSL_free(data);
  if (out != NULL && ret != NULL) {
    PKCS7_free(*out);
    *out = ret;
  }
  return ret;
}